

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O1

float * __thiscall
TPZSparseBlockDiagonal<float>::s(TPZSparseBlockDiagonal<float> *this,int64_t row,int64_t col)

{
  float *pfVar1;
  int64_t cblockindex;
  int64_t rblockindex;
  int64_t rblock;
  int64_t cblock;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  
  FindBlockIndex(this,row,&local_30,&local_38);
  pfVar1 = &TPZMatrix<float>::gZero;
  if (local_30 != -1) {
    FindBlockIndex(this,col,&local_28,&local_40);
    if (local_28 == local_30) {
      pfVar1 = (this->super_TPZBlockDiagonal<float>).fStorage.fStore +
               (this->super_TPZBlockDiagonal<float>).fBlockPos.fStore[local_30] +
               local_38 +
               (this->super_TPZBlockDiagonal<float>).fBlockSize.fStore[local_30] * local_40;
    }
  }
  return pfVar1;
}

Assistant:

TVar& TPZSparseBlockDiagonal<TVar>::s(const int64_t row, const int64_t col)
{
	int64_t rblock,rblockindex,cblock,cblockindex;
	FindBlockIndex(row,rblock,rblockindex);
	if(rblock == -1) return this->gZero;
	FindBlockIndex(col,cblock,cblockindex);
	if(cblock != rblock) return this->gZero;
	int64_t pos = rblockindex + cblockindex*this->fBlockSize[rblock];
	return this->fStorage[this->fBlockPos[rblock]+pos];
}